

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O0

bool __thiscall BinGE<1,_0,_1>::propagate(BinGE<1,_0,_1> *this)

{
  Reason r;
  bool bVar1;
  Lit LVar2;
  Lit LVar3;
  IntView<0> *this_00;
  int64_t iVar4;
  BoolView *in_RDI;
  Reason m_r_2;
  int64_t m_v_2;
  Reason m_r_1;
  int64_t m_v_1;
  Reason m_r;
  int64_t m_v;
  int64_t y_min;
  int64_t x_max;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  BoolView *in_stack_ffffffffffffff70;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  char o;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  Reason local_50;
  int64_t local_48;
  anon_union_8_2_743a5d44_for_Reason_0 local_40;
  int local_38;
  int local_34;
  anon_union_8_2_743a5d44_for_Reason_0 local_30;
  undefined8 local_28;
  int64_t local_20;
  long local_18;
  
  bVar1 = BoolView::isFalse(in_stack_ffffffffffffff70);
  if (!bVar1) {
    local_18 = IntView<1>::getMax((IntView<1> *)in_stack_ffffffffffffff70);
    local_20 = IntView<0>::getMin((IntView<0> *)in_stack_ffffffffffffff70);
    if (local_18 < local_20) {
      local_28 = 0;
      bVar1 = BoolView::setValNotR(in_stack_ffffffffffffff70,(bool)in_stack_ffffffffffffff6f);
      if (bVar1) {
        Reason::Reason((Reason *)&local_30,(Clause *)0x0);
        if ((so.lazy & 1U) != 0) {
          local_34 = (int)IntView<1>::getMaxLit
                                    ((IntView<1> *)
                                     CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          local_38 = (int)IntView<0>::getMinLit
                                    ((IntView<0> *)
                                     CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          Reason::Reason((Reason *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         (Lit)in_stack_ffffffffffffff94,(Lit)in_stack_ffffffffffffff90);
        }
        local_40 = local_30;
        bVar1 = BoolView::setVal(in_RDI,SUB81((ulong)in_stack_ffffffffffffff70 >> 0x38,0),
                                 (Reason)in_stack_ffffffffffffff80);
        if (!bVar1) {
          return false;
        }
      }
    }
    bVar1 = BoolView::isTrue(in_stack_ffffffffffffff70);
    if (bVar1) {
      local_48 = local_20;
      bVar1 = IntView<1>::setMinNotR
                        ((IntView<1> *)in_stack_ffffffffffffff70,
                         CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      if (bVar1) {
        Reason::Reason(&local_50,(Clause *)0x0);
        if ((so.lazy & 1U) != 0) {
          IntView<0>::getMinLit
                    ((IntView<0> *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          BoolView::getValLit((BoolView *)
                              CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          Reason::Reason((Reason *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         (Lit)in_stack_ffffffffffffff94,(Lit)in_stack_ffffffffffffff90);
        }
        bVar1 = IntView<1>::setMin((IntView<1> *)in_RDI,(int64_t)in_stack_ffffffffffffff70,
                                   (Reason)in_stack_ffffffffffffff80,(bool)in_stack_ffffffffffffff6f
                                  );
        if (!bVar1) {
          return false;
        }
      }
      o = (char)((uint)in_stack_ffffffffffffff8c >> 0x18);
      bVar1 = IntView<0>::setMaxNotR
                        ((IntView<0> *)in_stack_ffffffffffffff70,
                         CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      if (bVar1) {
        Reason::Reason((Reason *)&stack0xffffffffffffff90,(Clause *)0x0);
        if ((so.lazy & 1U) != 0) {
          LVar2 = IntView<1>::getMaxLit
                            ((IntView<1> *)
                             CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          LVar3 = BoolView::getValLit((BoolView *)
                                      CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68))
          ;
          Reason::Reason((Reason *)CONCAT44(LVar2.x,LVar3.x),(Lit)in_stack_ffffffffffffff94,
                         (Lit)in_stack_ffffffffffffff90);
          o = (char)((uint)LVar2.x >> 0x18);
        }
        r.field_0._a._4_4_ = in_stack_ffffffffffffff94;
        r.field_0._a._0_4_ = in_stack_ffffffffffffff90;
        bVar1 = IntView<0>::setMax((IntView<0> *)in_RDI,(int64_t)in_stack_ffffffffffffff70,r,
                                   (bool)in_stack_ffffffffffffff6f);
        if (!bVar1) {
          return false;
        }
      }
      this_00 = (IntView<0> *)IntView<1>::getMin((IntView<1> *)in_stack_ffffffffffffff70);
      iVar4 = IntView<0>::getMax(this_00);
      if (iVar4 <= (long)this_00) {
        Tchar::operator=((Tchar *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),o);
      }
    }
  }
  return true;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();

		// Can finesse!!
		if ((R != 0) && x_max < y_min) {
			setDom(r, setVal, 0, x.getMaxLit(), y.getMinLit());
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		// Finesses x's lower bound
		if (R != 0) {
			setDom(x, setMin, y_min, y.getMinLit(), r.getValLit());
		} else {
			setDom(x, setMin, y_min, y.getMinLit());
		}
		if (R != 0) {
			setDom(y, setMax, x_max, x.getMaxLit(), r.getValLit());
		} else {
			setDom(y, setMax, x_max, x.getMaxLit());
		}

		if (x.getMin() >= y.getMax()) {
			satisfied = true;
		}

		return true;
	}